

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.cpp
# Opt level: O0

bool fs_remove(string_view path)

{
  string_view path_00;
  uint uVar1;
  bool bVar2;
  byte local_79;
  string_view local_78;
  error_category *local_68;
  char *local_60;
  path local_58;
  undefined1 local_30 [8];
  error_code ec;
  string_view path_local;
  
  ec._M_cat = (error_category *)path._M_len;
  std::error_code::error_code((error_code *)local_30);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_58,(basic_string_view<char,_std::char_traits<char>_> *)&ec._M_cat,auto_format);
  uVar1 = std::filesystem::remove(&local_58,(error_code *)local_30);
  local_79 = 0;
  if ((uVar1 & 1) != 0) {
    bVar2 = std::error_code::operator_cast_to_bool((error_code *)local_30);
    local_79 = bVar2 ^ 0xff;
  }
  std::filesystem::__cxx11::path::~path(&local_58);
  bVar2 = (local_79 & 1) != 0;
  if (!bVar2) {
    local_68 = ec._M_cat;
    local_60 = path._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"fs_remove");
    path_00._M_str = local_60;
    path_00._M_len = (size_t)local_68;
    fs_print_error(path_00,local_78,(error_code *)local_30);
  }
  return bVar2;
}

Assistant:

bool
fs_remove(std::string_view path)
{
  // remove a file or empty directory
  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  // https://en.cppreference.com/w/cpp/filesystem/remove
  if(std::filesystem::remove(path, ec) && !ec) FFS_LIKELY
    return true;
#else
  // https://en.cppreference.com/w/cpp/io/c/remove
  if(std::remove(path.data()) == 0)
    return true;

#ifdef _WIN32
  // https://docs.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-deletefilea
  // may need these when deleting a symlink
  // https://learn.microsoft.com/en-us/windows/win32/api/winbase/nf-winbase-createsymboliclinka#remarks

  if(fs_is_file(path)){
    if(DeleteFileA(path.data()) != 0)
      return true;
  } else if(fs_is_dir(path)){
    if(RemoveDirectoryA(path.data()) != 0)
      return true;
  }

#endif

#endif

  fs_print_error(path, __func__, ec);
  return false;
}